

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O1

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::clear(robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
        *this)

{
  pointer pbVar1;
  bucket_entry<std::pair<unsigned_long,_double>,_false> *bucket;
  pointer pbVar2;
  bucket_entry *pbVar3;
  pointer pbVar4;
  
  if (0.0 < this->m_min_load_factor) {
    (this->super_power_of_two_growth_policy<2UL>).m_mask = 0;
    pbVar2 = (this->m_buckets_data).
             super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->m_buckets_data).
             super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = pbVar2;
    if (pbVar1 != pbVar2) {
      do {
        if (pbVar4->m_dist_from_ideal_bucket != -1) {
          pbVar4->m_dist_from_ideal_bucket = -1;
        }
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != pbVar1);
      (this->m_buckets_data).
      super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
    }
    pbVar3 = static_empty_bucket_ptr(this);
    this->m_buckets = pbVar3;
    this->m_grow_on_next_insert = false;
    this->m_try_shrink_on_next_insert = false;
    this->m_bucket_count = 0;
    this->m_nb_elements = 0;
    this->m_load_threshold = 0;
    return;
  }
  pbVar1 = (this->m_buckets_data).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->m_buckets_data).
                super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    if (pbVar2->m_dist_from_ideal_bucket != -1) {
      pbVar2->m_dist_from_ideal_bucket = -1;
    }
  }
  this->m_nb_elements = 0;
  this->m_grow_on_next_insert = false;
  return;
}

Assistant:

void clear() noexcept {
    if (m_min_load_factor > 0.0f) {
      clear_and_shrink();
    } else {
      for (auto& bucket : m_buckets_data) {
        bucket.clear();
      }

      m_nb_elements = 0;
      m_grow_on_next_insert = false;
    }
  }